

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Mock::Register(void *mock_obj,UntypedFunctionMockerBase *mocker)

{
  StateMap *this;
  mapped_type *pmVar1;
  GTestMutexLock local_20;
  MutexLock l;
  UntypedFunctionMockerBase *mocker_local;
  void *mock_obj_local;
  
  l.mutex_ = (MutexBase *)mocker;
  mocker_local = (UntypedFunctionMockerBase *)mock_obj;
  internal::GTestMutexLock::GTestMutexLock(&local_20,(MutexBase *)internal::g_gmock_mutex);
  this = anon_unknown_18::MockObjectRegistry::states
                   ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  pmVar1 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[](this,&mocker_local);
  std::
  set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
  ::insert(&pmVar1->function_mockers,(value_type *)&l);
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  return;
}

Assistant:

void Mock::Register(const void* mock_obj,
                    internal::UntypedFunctionMockerBase* mocker) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  g_mock_object_registry.states()[mock_obj].function_mockers.insert(mocker);
}